

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:294:72)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:294:72)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  property_attribute a;
  value *v;
  long *plVar2;
  pointer v_00;
  gc_heap_ptr_untyped gStack_58;
  object_ptr o;
  
  v = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  global_object::validate_object((global_object *)&o,v);
  plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&o);
  v_00 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
         super__Vector_impl_data._M_start;
  if ((int)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)v_00) / 0x28) < 1) {
    v_00 = (pointer)&value::undefined;
  }
  to_string((mjs *)&gStack_58,o.super_gc_heap_ptr_untyped.heap_,v_00);
  string::view((string *)&gStack_58);
  a = (**(code **)(*plVar2 + 0x30))(plVar2);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_58);
  bVar1 = is_valid(a);
  __return_storage_ptr__->type_ = boolean;
  (__return_storage_ptr__->field_1).b_ = (a & dont_enum) == none && bVar1;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }